

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::focusInEvent(QGraphicsView *this,QFocusEvent *event)

{
  QPointer<QGraphicsScene> *this_00;
  QGraphicsViewPrivate *this_01;
  Data *pDVar1;
  bool bVar2;
  QObject *pQVar3;
  
  this_01 = *(QGraphicsViewPrivate **)(this + 8);
  QGraphicsViewPrivate::updateInputMethodSensitivity(this_01);
  QWidget::focusInEvent((QWidget *)this,event);
  this_00 = &this_01->scene;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    pDVar1 = (this_00->wp).d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = (this_01->scene).wp.value;
    }
    QCoreApplication::sendEvent(pQVar3,(QEvent *)event);
  }
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if ((bVar2) && (event[0xc] != (QFocusEvent)0x0)) {
    return;
  }
  QWidget::focusInEvent((QWidget *)this,event);
  return;
}

Assistant:

void QGraphicsView::focusInEvent(QFocusEvent *event)
{
    Q_D(QGraphicsView);
    d->updateInputMethodSensitivity();
    QAbstractScrollArea::focusInEvent(event);
    if (d->scene)
        QCoreApplication::sendEvent(d->scene, event);
    // Pass focus on if the scene cannot accept focus.
    if (!d->scene || !event->isAccepted())
        QAbstractScrollArea::focusInEvent(event);
}